

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracking_ptr.hpp
# Opt level: O1

intrusive_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
 __thiscall
boost::xpressive::detail::
tracking_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::fork_(tracking_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        *this)

{
  atomic_count *paVar1;
  element_type *peVar2;
  regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *prVar3;
  shared_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *psVar4;
  _Rb_tree_header *p_Var5;
  long *in_RSI;
  shared_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  simpl;
  shared_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28;
  intrusive_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_18;
  
  (this->impl_).px =
       (regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)0x0;
  if ((*in_RSI == 0) || (*(int *)(*in_RSI + 0x70) != 1)) {
    prVar3 = (regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)*in_RSI;
    if (prVar3 != (regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)0x0) {
      LOCK();
      paVar1 = &(prVar3->
                super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ).cnt_;
      paVar1->value_ = paVar1->value_ + 1;
      UNLOCK();
    }
    local_28.px = (this->impl_).px;
    (this->impl_).px = prVar3;
    intrusive_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~intrusive_ptr((intrusive_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_28);
    prVar3 = (regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)operator_new(0xb8);
    p_Var5 = &(prVar3->
              super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ).refs_._M_t._M_impl.super__Rb_tree_header;
    (prVar3->
    super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ).refs_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (prVar3->
    super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ).refs_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    (prVar3->
    super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ).refs_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    (prVar3->
    super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ).refs_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    *(undefined8 *)
     &(prVar3->
      super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ).refs_._M_t._M_impl = 0;
    *(undefined8 *)
     &(prVar3->
      super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ).refs_._M_t._M_impl.super__Rb_tree_header._M_header = 0;
    (prVar3->
    super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ).refs_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var5->_M_header;
    (prVar3->
    super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ).refs_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var5->_M_header;
    p_Var5 = &(prVar3->
              super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ).deps_._M_t._M_impl.super__Rb_tree_header;
    (prVar3->
    super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ).deps_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    (prVar3->
    super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ).deps_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    *(undefined8 *)
     &(prVar3->
      super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ).deps_._M_t._M_impl.super__Rb_tree_header._M_header = 0;
    (prVar3->
    super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ).deps_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    (prVar3->
    super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ).refs_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    *(undefined8 *)
     &(prVar3->
      super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ).deps_._M_t._M_impl = 0;
    (prVar3->
    super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ).deps_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var5->_M_header;
    (prVar3->
    super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ).deps_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var5->_M_header;
    (prVar3->
    super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ).deps_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    (prVar3->
    super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ).self_.px = (element_type *)0x0;
    *(undefined8 *)
     ((long)&(prVar3->
             super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ).self_.px + 4) = 0;
    *(undefined8 *)
     ((long)&(prVar3->
             super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ).self_.pn.pi_ + 4) = 0;
    (prVar3->xpr_).px =
         (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    (prVar3->traits_).px = (traits<char> *)0x0;
    (prVar3->finder_).px =
         (finder<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x0;
    (prVar3->named_marks_).
    super__Vector_base<boost::xpressive::detail::named_mark<char>,_std::allocator<boost::xpressive::detail::named_mark<char>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (prVar3->named_marks_).
    super__Vector_base<boost::xpressive::detail::named_mark<char>,_std::allocator<boost::xpressive::detail::named_mark<char>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (prVar3->named_marks_).
    super__Vector_base<boost::xpressive::detail::named_mark<char>,_std::allocator<boost::xpressive::detail::named_mark<char>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    prVar3->mark_count_ = 0;
    prVar3->hidden_mark_count_ = 0;
    shared_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
    ::
    shared_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
              ((shared_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
                *)&local_28,prVar3);
    psVar4 = shared_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator=(&((local_28.px)->
                          super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ).self_,&local_28);
    peVar2 = psVar4->px;
    if (peVar2 != (element_type *)0x0) {
      LOCK();
      paVar1 = &(peVar2->
                super_enable_reference_tracking<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ).cnt_;
      paVar1->value_ = paVar1->value_ + 1;
      UNLOCK();
    }
    local_18.px = (regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)*in_RSI;
    *in_RSI = (long)peVar2;
    intrusive_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~intrusive_ptr(&local_18);
    boost::detail::shared_count::~shared_count(&local_28.pn);
  }
  return (intrusive_ptr<boost::xpressive::detail::regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )(regex_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this;
}

Assistant:

intrusive_ptr<element_type> fork_() const
    {
        intrusive_ptr<element_type> impl;
        if(!this->impl_ || 1 != this->impl_->use_count())
        {
            impl = this->impl_;
            BOOST_ASSERT(!this->has_deps_());
            shared_ptr<element_type> simpl(new element_type);
            this->impl_ = get_pointer(simpl->self_ = simpl);
        }
        return impl;
    }